

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtClipPolygon.h
# Opt level: O2

int bt_plane_clip_polygon
              (cbtVector4 *plane,cbtVector3 *polygon_points,int polygon_point_count,
              cbtVector3 *clipped)

{
  cbtVector3 *point;
  undefined8 uVar1;
  long lVar2;
  cbtScalar dist0;
  int clipped_count;
  cbtScalar local_44;
  cbtScalar local_40;
  cbtScalar local_3c;
  cbtVector3 *local_38;
  
  clipped_count = 0;
  local_44 = bt_distance_point_plane(plane,polygon_points);
  if (local_44 <= 1.1920929e-07) {
    uVar1 = *(undefined8 *)(polygon_points->m_floats + 2);
    *(undefined8 *)clipped->m_floats = *(undefined8 *)polygon_points->m_floats;
    *(undefined8 *)(clipped->m_floats + 2) = uVar1;
    clipped_count = 1;
  }
  dist0 = local_44;
  local_38 = polygon_points;
  for (lVar2 = 1; lVar2 < polygon_point_count; lVar2 = lVar2 + 1) {
    point = polygon_points + 1;
    local_40 = dist0;
    local_3c = bt_distance_point_plane(plane,point);
    bt_plane_clip_polygon_collect(polygon_points,point,local_40,local_3c,clipped,&clipped_count);
    polygon_points = point;
    dist0 = local_3c;
  }
  bt_plane_clip_polygon_collect
            (local_38 + (long)polygon_point_count + -1,local_38,dist0,local_44,clipped,
             &clipped_count);
  return clipped_count;
}

Assistant:

SIMD_FORCE_INLINE int bt_plane_clip_polygon(
	const cbtVector4 &plane,
	const cbtVector3 *polygon_points,
	int polygon_point_count,
	cbtVector3 *clipped)
{
	int clipped_count = 0;

	//clip first point
	cbtScalar firstdist = bt_distance_point_plane(plane, polygon_points[0]);
	;
	if (!(firstdist > SIMD_EPSILON))
	{
		clipped[clipped_count] = polygon_points[0];
		clipped_count++;
	}

	cbtScalar olddist = firstdist;
	for (int i = 1; i < polygon_point_count; i++)
	{
		cbtScalar dist = bt_distance_point_plane(plane, polygon_points[i]);

		bt_plane_clip_polygon_collect(
			polygon_points[i - 1], polygon_points[i],
			olddist,
			dist,
			clipped,
			clipped_count);

		olddist = dist;
	}

	//RETURN TO FIRST  point

	bt_plane_clip_polygon_collect(
		polygon_points[polygon_point_count - 1], polygon_points[0],
		olddist,
		firstdist,
		clipped,
		clipped_count);

	return clipped_count;
}